

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  byte bVar1;
  int i;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *vFuncs;
  word *pwVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  char *p_00;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  
  bVar1 = (byte)nOuts & 0x1f;
  uVar11 = 1 << bVar1;
  iVar2 = vRel->nSize / (int)uVar11;
  vFuncs = Vec_WrdStart(nOuts * iVar2 * 2);
  if ((vRel->nSize & uVar11 - 1) == 0) {
    uVar3 = iVar2 << 6;
    uVar9 = 0;
    uVar10 = 0;
    if (0 < 1 << bVar1) {
      uVar10 = uVar11;
    }
    uVar8 = 0;
    if (0 < nOuts) {
      uVar8 = nOuts;
    }
    uVar6 = 0;
    if (0 < iVar2 << 6) {
      uVar6 = uVar3;
    }
    for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      uVar13 = 0;
      while ((uVar14 = uVar10, uVar10 != uVar13 &&
             (uVar7 = (uVar4 << ((byte)nOuts & 0x1f)) + uVar13, uVar14 = uVar13,
             (vRel->pArray[(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0))) {
        uVar13 = uVar13 + 1;
      }
      iVar12 = 0;
      for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        i = iVar2 + iVar12;
        if ((uVar14 >> (uVar13 & 0x1f) & 1) == 0) {
          i = iVar12;
        }
        pwVar5 = Vec_WrdEntryP(vFuncs,i);
        pwVar5[uVar4 >> 6] = pwVar5[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
        iVar12 = iVar12 + iVar2 * 2;
      }
      uVar9 = (ulong)((int)uVar9 + (uint)(uVar14 == uVar11));
    }
    if ((int)uVar9 == 0) {
      p_00 = "The relation was successfully determized without don\'t-cares for %d patterns.\n";
      printf("The relation was successfully determized without don\'t-cares for %d patterns.\n",
             (ulong)uVar3);
    }
    else {
      p_00 = "The relation is not well-defined for %d (out of %d) patterns.\n";
      printf("The relation is not well-defined for %d (out of %d) patterns.\n",uVar9,(ulong)uVar3);
    }
    Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_00,vRel,nOuts,vFuncs);
    return vFuncs;
  }
  __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x31a,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs(Gia_Man_t *, Vec_Wrd_t *, int)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
        printf( "The relation was successfully determized without don't-cares for %d patterns.\n", 64 * nWords );
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}